

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaper.cpp
# Opt level: O2

void __thiscall zmq::reaper_t::process_stop(reaper_t *this)

{
  this->_terminating = true;
  if (this->_sockets != 0) {
    return;
  }
  object_t::send_done(&this->super_object_t);
  epoll_t::rm_fd(this->_poller,this->_mailbox_handle);
  epoll_t::stop(this->_poller);
  return;
}

Assistant:

void zmq::reaper_t::process_stop ()
{
    _terminating = true;

    //  If there are no sockets being reaped finish immediately.
    if (!_sockets) {
        send_done ();
        _poller->rm_fd (_mailbox_handle);
        _poller->stop ();
    }
}